

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_term(Parser *this)

{
  VM_Writer *pVVar1;
  bool bVar2;
  int index;
  size_type sVar3;
  ostream *poVar4;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  undefined1 local_210 [8];
  string symbol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [8];
  string temp_identifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_30 [8];
  string cur_token_type;
  Parser *this_local;
  
  cur_token_type.field_2._8_8_ = this;
  Tokenizer::type((string *)local_30,this->tokenizer,&this->cur_token);
  bVar2 = std::operator==((string *)local_30,"IDENTIFIER");
  if (bVar2) {
    poVar4 = (ostream *)this->out_file;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&temp_identifier.field_2 + 8),"\t\t\t\t\t<identifier>",&this->cur_token);
    std::operator+(&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&temp_identifier.field_2 + 8),"</identifier>");
    poVar4 = std::operator<<(poVar4,(string *)&local_60);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)(temp_identifier.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_a0);
    query_tokenizer(this);
    bVar2 = is_array(this);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>[</symbol>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      parse_expression(this);
      poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>]</symbol>");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    parse_subroutine_call(this);
    std::__cxx11::string::~string(local_a0);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"STRING_CONST");
    if (((bVar2) ||
        (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_30,"INT_CONST"), bVar2)) ||
       (sVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::count(&this->keyword_constant_map,&this->cur_token), sVar3 != 0)) {
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                      "INT_CONST");
      poVar4 = (ostream *)this->out_file;
      std::operator+(&local_160,"\t\t\t\t\t<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
      std::operator+(&local_140,&local_160,">");
      std::operator+(&local_120,&local_140,&this->cur_token);
      std::operator+(&local_100,&local_120,"</");
      std::operator+(&local_e0,&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
      std::operator+(&local_c0,&local_e0,">");
      poVar4 = std::operator<<(poVar4,(string *)&local_c0);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      query_tokenizer(this);
    }
    else {
      bVar2 = std::operator==(&this->cur_token,"(");
      if (bVar2) {
        poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>(</symbol>");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        query_tokenizer(this);
        parse_expression(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,")",&local_181);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,"expression",&local_1a9);
        check_expected_x_after_y(this,&local_180,&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::allocator<char>::~allocator(&local_1a9);
        std::__cxx11::string::~string((string *)&local_180);
        std::allocator<char>::~allocator(&local_181);
        poVar4 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>)</symbol>");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        query_tokenizer(this);
      }
      else {
        bVar2 = std::operator==(&this->cur_token,"-");
        if ((bVar2) || (bVar2 = std::operator==(&this->cur_token,"~"), bVar2)) {
          poVar4 = (ostream *)this->out_file;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&symbol.field_2 + 8),"\t\t\t\t\t<symbol>",&this->cur_token);
          std::operator+(&local_1d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&symbol.field_2 + 8),"</symbol>");
          poVar4 = std::operator<<(poVar4,(string *)&local_1d0);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)(symbol.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_210,(string *)&this->cur_token);
          query_tokenizer(this);
          Tokenizer::type(&local_230,this->tokenizer,&this->cur_token);
          bVar2 = std::operator==(&local_230,"INT_CONST");
          std::__cxx11::string::~string((string *)&local_230);
          if (bVar2) {
            pVVar1 = this->vm_writer;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_250,"constant",&local_251);
            index = std::__cxx11::stoi(&this->cur_token,(size_t *)0x0,10);
            VM_Writer::write_push(pVVar1,&local_250,index);
            std::__cxx11::string::~string((string *)&local_250);
            std::allocator<char>::~allocator(&local_251);
          }
          parse_term(this);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_210,"-");
          if (bVar2) {
            pVVar1 = this->vm_writer;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_278,"neg",&local_279);
            VM_Writer::operator<<(pVVar1,&local_278);
            std::__cxx11::string::~string((string *)&local_278);
            std::allocator<char>::~allocator(&local_279);
          }
          else {
            pVVar1 = this->vm_writer;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"~",&local_2a1);
            VM_Writer::write_arithmetic(pVVar1,&local_2a0);
            std::__cxx11::string::~string((string *)&local_2a0);
            std::allocator<char>::~allocator(&local_2a1);
          }
          std::__cxx11::string::~string((string *)local_210);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void Parser::parse_term() {

    std::string cur_token_type = tokenizer.type(cur_token);
    if (cur_token_type == "IDENTIFIER") {
        out_file << "\t\t\t\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
        std::string temp_identifier;

        query_tokenizer();
        if (is_array())
        {
            out_file << "\t\t\t\t\t<symbol>[</symbol>" << std::endl;
            parse_expression();
            out_file << "\t\t\t\t\t<symbol>]</symbol>" << std::endl;
        }
        parse_subroutine_call();
    }
    else if (cur_token_type == "STRING_CONST" || cur_token_type == "INT_CONST" ||
                                                                            keyword_constant_map.count(cur_token) > 0) {
        if (cur_token_type == "INT_CONST") {
        }
        out_file << "\t\t\t\t\t<" + cur_token_type +  ">" +
                    cur_token + "</" + cur_token_type + ">" << std::endl;
//        vm_writer.write_push("constant", std::stoi(cur_token));
        query_tokenizer();
    }
    else if(cur_token == "(") {
        out_file << "\t\t\t\t\t<symbol>(</symbol>" << std::endl;
        query_tokenizer();
        parse_expression();

        check_expected_x_after_y(")", "expression");
        out_file << "\t\t\t\t\t<symbol>)</symbol>" << std::endl;
        query_tokenizer();
    }
    else if (cur_token == "-" || cur_token == "~") {
        out_file << "\t\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
        std::string symbol = cur_token;

        query_tokenizer();
        // need to create an exception for int const values
        if (tokenizer.type(cur_token) == "INT_CONST") {
            vm_writer.write_push("constant", std::stoi(cur_token));
        }
        parse_term();
        if (symbol == "-") {
            vm_writer << "neg";
        }
        else {
            vm_writer.write_arithmetic("~");
        }
    }
}